

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O0

void __thiscall
despot::RandomPolicy::RandomPolicy
          (RandomPolicy *this,DSPOMDP *model,vector<double,_std::allocator<double>_> *action_probs,
          ParticleLowerBound *bound)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_44;
  double dStack_40;
  int i;
  double sum;
  ParticleLowerBound *bound_local;
  vector<double,_std::allocator<double>_> *action_probs_local;
  DSPOMDP *model_local;
  RandomPolicy *this_local;
  
  DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  (this->super_DefaultPolicy).super_ScenarioLowerBound._vptr_ScenarioLowerBound =
       (_func_int **)&PTR__RandomPolicy_0026e298;
  std::vector<double,_std::allocator<double>_>::vector(&this->action_probs_,action_probs);
  dStack_40 = 0.0;
  local_44 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(action_probs);
    if (sVar1 <= (ulong)(long)local_44) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](action_probs,(long)local_44);
    dStack_40 = *pvVar2 + dStack_40;
    local_44 = local_44 + 1;
  }
  if (ABS(dStack_40 - 1.0) < 1e-08) {
    return;
  }
  __assert_fail("fabs(sum - 1.0) < 1.0e-8",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/builtin_policy.cpp"
                ,0x30,
                "despot::RandomPolicy::RandomPolicy(const DSPOMDP *, const vector<double> &, ParticleLowerBound *)"
               );
}

Assistant:

RandomPolicy::RandomPolicy(const DSPOMDP* model,
	const vector<double>& action_probs,
	ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	action_probs_(action_probs) {
	double sum = 0;
	for (int i = 0; i < action_probs.size(); i++)
		sum += action_probs[i];
	assert(fabs(sum - 1.0) < 1.0e-8);
}